

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void entityTrackingReportStats(XML_Parser rootParser,ENTITY *entity,char *action,int sourceLine)

{
  char *pcVar1;
  char *entityName;
  int sourceLine_local;
  char *action_local;
  ENTITY *entity_local;
  XML_Parser rootParser_local;
  
  if (rootParser->m_parentParser != (XML_Parser)0x0) {
    __assert_fail("! rootParser->m_parentParser",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                  ,0x1f20,"void entityTrackingReportStats(XML_Parser, ENTITY *, const char *, int)")
    ;
  }
  if ((rootParser->m_entity_stats).debugLevel != 0) {
    pcVar1 = "&";
    if (entity->is_param != '\0') {
      pcVar1 = "%";
    }
    fprintf(_stderr,
            "expat: Entities(%p): Count %9u, depth %2u/%2u %*s%s%s; %s length %d (xmlparse.c:%d)\n",
            rootParser,(ulong)(rootParser->m_entity_stats).countEverOpened,
            (ulong)(rootParser->m_entity_stats).currentDepth,
            (ulong)(rootParser->m_entity_stats).maximumDepthSeen,
            ((rootParser->m_entity_stats).currentDepth - 1) * 2,"",pcVar1,entity->name,action,
            entity->textLen,sourceLine);
  }
  return;
}

Assistant:

static void
entityTrackingReportStats(XML_Parser rootParser, ENTITY *entity,
                          const char *action, int sourceLine) {
  assert(! rootParser->m_parentParser);
  if (rootParser->m_entity_stats.debugLevel == 0u)
    return;

#  if defined(XML_UNICODE)
  const char *const entityName = "[..]";
#  else
  const char *const entityName = entity->name;
#  endif

  fprintf(
      stderr,
      "expat: Entities(%p): Count %9u, depth %2u/%2u %*s%s%s; %s length %d (xmlparse.c:%d)\n",
      (void *)rootParser, rootParser->m_entity_stats.countEverOpened,
      rootParser->m_entity_stats.currentDepth,
      rootParser->m_entity_stats.maximumDepthSeen,
      (rootParser->m_entity_stats.currentDepth - 1) * 2, "",
      entity->is_param ? "%" : "&", entityName, action, entity->textLen,
      sourceLine);
}